

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::JunitReporter::assertionEnded(JunitReporter *this,AssertionStats *assertionStats)

{
  if (((assertionStats->assertionResult).m_resultData.resultType == ThrewException) &&
     (this->m_okToFail == false)) {
    this->unexpectedExceptions = this->unexpectedExceptions + 1;
  }
  prepareExpandedExpression(&assertionStats->assertionResult);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::push_back
            (&((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_sectionStack.
               super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->assertions,assertionStats);
  return true;
}

Assistant:

bool JunitReporter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() == ResultWas::ThrewException && !m_okToFail )
            unexpectedExceptions++;
        return CumulativeReporterBase::assertionEnded( assertionStats );
    }